

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

void LTRegularUpdates(void)

{
  int iVar1;
  int currCycleNum;
  DataRefs *in_stack_00000020;
  
  iVar1 = XPLMGetCycleNumber();
  if (LTRegularUpdates::lstCycleNum != iVar1) {
    LTRegularUpdates::lstCycleNum = iVar1;
    DataRefs::UpdateCachedValues(in_stack_00000020);
    CheckThenShowMsgWindow();
    LTFlightData::AppendAllNewPos();
    FlushMsg();
  }
  return;
}

Assistant:

void LTRegularUpdates()
{
    // only update once per flight loop cycle
    static int lstCycleNum = -1;
    const int currCycleNum = XPLMGetCycleNumber();
    if (lstCycleNum == currCycleNum)
        return;
    lstCycleNum = currCycleNum;
    
    // all calls needed (up to) every flight loop:
    
    // Update cached values
    dataRefs.UpdateCachedValues();
    
    // Check if some msg window needs to show
    CheckThenShowMsgWindow();

    // handle new network data (that func has a short-cut exit if nothing to do)
    LTFlightData::AppendAllNewPos();

    // Flush out all non-written log messages
    FlushMsg();
}